

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_assert.cpp
# Opt level: O0

void crnlib_assert(char *pExp,char *pFile,uint line)

{
  bool bVar1;
  uint in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  char buf [512];
  char acStack_218 [536];
  
  snprintf(acStack_218,0x200,"%s(%u): Assertion failed: \"%s\"\n",in_RSI,(ulong)in_EDX,in_RDI);
  crnlib_output_debug_string((char *)0x1179a4);
  fputs(acStack_218,_stderr);
  bVar1 = crnlib_is_debugger_present();
  if (bVar1) {
    crnlib_debug_break();
  }
  return;
}

Assistant:

void crnlib_assert(const char* pExp, const char* pFile, unsigned line) {
  char buf[512];

  crnlib_snprintf(buf, sizeof(buf), "%s(%u): Assertion failed: \"%s\"\n", pFile, line, pExp);

  crnlib_output_debug_string(buf);

  fputs(buf, stderr);

  if (crnlib_is_debugger_present())
    crnlib_debug_break();
}